

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O2

void __thiscall VertexClustering::VertexClustering(VertexClustering *this,Options *opts)

{
  vector<VCCluster_*,_std::allocator<VCCluster_*>_> *this_00;
  _Rb_tree_header *p_Var1;
  undefined4 uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  VertexGroup *this_01;
  VCClusterAnisoQuad *this_02;
  VCClusterAniso *this_03;
  VCClusterQuad *this_04;
  VCCluster *this_05;
  pointer ppVVar8;
  int i;
  ulong uVar9;
  
  (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->clusters).super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edgeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->edgeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this_00 = &this->clusters;
  p_Var1 = &(this->edgeMap)._M_t._M_impl.super__Rb_tree_header;
  (this->edgeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->edgeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->edgeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::queue<VCEdge,std::deque<VCEdge,std::allocator<VCEdge>>>::
  queue<std::deque<VCEdge,std::allocator<VCEdge>>,void>(&this->boundary);
  this->cntFace = 0;
  srand(opts->seed);
  if (opts->anisotropic == true) {
    opts->adaptive = true;
  }
  uVar2 = *(undefined4 *)&opts->field_0x14;
  (this->opts).seed = opts->seed;
  *(undefined4 *)&(this->opts).field_0x14 = uVar2;
  bVar3 = opts->adaptive;
  bVar4 = opts->anisotropic;
  bVar5 = opts->quadMetric;
  bVar6 = opts->validation;
  iVar7 = opts->ringLevel;
  (this->opts).numCluster = opts->numCluster;
  (this->opts).adaptive = bVar3;
  (this->opts).anisotropic = bVar4;
  (this->opts).quadMetric = bVar5;
  (this->opts).validation = bVar6;
  (this->opts).ringLevel = iVar7;
  this_01 = (VertexGroup *)operator_new(0x4c4b410);
  VertexGroup::VertexGroup(this_01);
  this->vGroup = this_01;
  this->vGroupNew = (VertexGroup *)0x0;
  this->angle_min = 180.0;
  this->angle_less_30 = 100.0;
  std::vector<VCCluster_*,_std::allocator<VCCluster_*>_>::resize(this_00,opts->numCluster + 1);
  if (opts->anisotropic == true) {
    uVar9 = 0;
    if (opts->quadMetric == false) {
      for (; ppVVar8 = (this->clusters).
                       super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
                       super__Vector_impl_data._M_start,
          uVar9 < (ulong)((long)(this->clusters).
                                super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar8 >> 3);
          uVar9 = uVar9 + 1) {
        this_03 = (VCClusterAniso *)operator_new(0x150);
        VCClusterAniso::VCClusterAniso(this_03,(int)uVar9);
        (this_00->super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar9] = (VCCluster *)this_03;
      }
    }
    else {
      for (; ppVVar8 = (this->clusters).
                       super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
                       super__Vector_impl_data._M_start,
          uVar9 < (ulong)((long)(this->clusters).
                                super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar8 >> 3);
          uVar9 = uVar9 + 1) {
        this_02 = (VCClusterAnisoQuad *)operator_new(0x160);
        VCClusterAnisoQuad::VCClusterAnisoQuad(this_02,(int)uVar9);
        (this_00->super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar9] = (VCCluster *)this_02;
      }
    }
  }
  else {
    uVar9 = 0;
    if (opts->quadMetric == false) {
      for (; ppVVar8 = (this->clusters).
                       super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
                       super__Vector_impl_data._M_start,
          uVar9 < (ulong)((long)(this->clusters).
                                super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar8 >> 3);
          uVar9 = uVar9 + 1) {
        this_05 = (VCCluster *)operator_new(0xf0);
        VCCluster::VCCluster(this_05,(int)uVar9);
        (this_00->super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar9] = this_05;
      }
    }
    else {
      for (; ppVVar8 = (this->clusters).
                       super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>._M_impl.
                       super__Vector_impl_data._M_start,
          uVar9 < (ulong)((long)(this->clusters).
                                super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar8 >> 3);
          uVar9 = uVar9 + 1) {
        this_04 = (VCClusterQuad *)operator_new(0x100);
        VCClusterQuad::VCClusterQuad(this_04,(int)uVar9);
        (this_00->super__Vector_base<VCCluster_*,_std::allocator<VCCluster_*>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar9] = (VCCluster *)this_04;
      }
    }
  }
  (*ppVVar8)->isNull = true;
  return;
}

Assistant:

VertexClustering::VertexClustering(VertexClustering::Options &opts): cntFace(0)
{
	srand(opts.seed);
	if (opts.anisotropic) {
		opts.adaptive = true;
	}
	this->opts = opts;
	vGroup = new VertexGroup();
	vGroupNew = NULL;
	angle_min = 180;
	angle_less_30 = 100;
	clusters.resize(opts.numCluster + 1); 
	if (opts.anisotropic) {
		if (opts.quadMetric) {
			for (int i = 0; i < clusters.size(); i++)
				clusters[i] = new VCClusterAnisoQuad(i);
		}
		else {
			for (int i = 0; i < clusters.size(); i++)
				clusters[i] = new VCClusterAniso(i);
		}
	}
	else
		if (opts.quadMetric) {
			for (int i = 0; i < clusters.size(); i++)
				clusters[i] = new VCClusterQuad(i);
		}
		else {
			for (int i = 0; i < clusters.size(); i++)
				clusters[i] = new VCCluster(i);
		}
	clusters[0]->isNull = true;
}